

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O1

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance,uchar *input,size_t inLen)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  uchar intermediate [32];
  uchar local_58 [40];
  
  if (ktInstance->phase != ABSORBING) {
    return 1;
  }
  uVar3 = ktInstance->queueAbsorbedLen;
  if (ktInstance->blockNumber == 0) {
    sVar5 = inLen & 0xffffffff;
    if (0x2000 - uVar3 <= inLen) {
      sVar5 = (size_t)(0x2000 - uVar3);
    }
    iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,input,sVar5);
    if (iVar2 == 0) {
      input = input + sVar5;
      uVar3 = ktInstance->queueAbsorbedLen + (int)sVar5;
      inLen = inLen - sVar5;
      ktInstance->queueAbsorbedLen = uVar3;
      bVar1 = true;
      if (inLen != 0 && uVar3 == 0x2000) {
        local_58[0] = '\x03';
        ktInstance->queueAbsorbedLen = 0;
        ktInstance->blockNumber = 1;
        iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,1);
        if (iVar2 != 0) goto LAB_0011b9fe;
        (ktInstance->finalNode).byteIOIndex = (ktInstance->finalNode).byteIOIndex + 7 & 0xfffffff8;
      }
    }
    else {
LAB_0011b9fe:
      bVar1 = false;
    }
  }
  else {
    if (uVar3 == 0) goto LAB_0011bb0d;
    sVar5 = inLen & 0xffffffff;
    if (0x2000 - uVar3 <= inLen) {
      sVar5 = (size_t)(0x2000 - uVar3);
    }
    iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode,input,sVar5);
    if (iVar2 == 0) {
      input = input + sVar5;
      inLen = inLen - sVar5;
      uVar3 = ktInstance->queueAbsorbedLen + (int)sVar5;
      ktInstance->queueAbsorbedLen = uVar3;
      if (uVar3 == 0x2000) {
        ktInstance->queueAbsorbedLen = 0;
        ktInstance->blockNumber = ktInstance->blockNumber + 1;
        iVar2 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
        if (((iVar2 != 0) ||
            (iVar2 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_58,0x20),
            iVar2 != 0)) ||
           (iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,0x20),
           iVar2 != 0)) {
          bVar1 = false;
          goto joined_r0x0011bafc;
        }
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
joined_r0x0011bafc:
  if (!bVar1) {
    return 1;
  }
LAB_0011bb0d:
  do {
    if (inLen == 0) {
      return 0;
    }
    sVar5 = 0x2000;
    if (inLen < 0x2000) {
      sVar5 = inLen;
    }
    iVar2 = KeccakWidth1600_12rounds_SpongeInitialize(&ktInstance->queueNode,0x540,0x100);
    if ((iVar2 == 0) &&
       (iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode,input,sVar5),
       iVar2 == 0)) {
      input = input + sVar5;
      uVar4 = inLen - sVar5;
      if (inLen < 0x2000) {
        ktInstance->queueAbsorbedLen = (uint)sVar5;
      }
      else {
        ktInstance->blockNumber = ktInstance->blockNumber + 1;
        iVar2 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
        if (((iVar2 != 0) ||
            (iVar2 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_58,0x20),
            iVar2 != 0)) ||
           (iVar2 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_58,0x20),
           iVar2 != 0)) {
          bVar1 = false;
          goto LAB_0011bb61;
        }
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
      uVar4 = inLen;
    }
LAB_0011bb61:
    inLen = uVar4;
    if (!bVar1) {
      return 1;
    }
  } while( true );
}

Assistant:

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance, const unsigned char *input, size_t inLen)
{
    if (ktInstance->phase != ABSORBING)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* First block, absorb in final node */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( (ktInstance->queueAbsorbedLen == chunkSize) && (inLen != 0) ) {
            /* First block complete and more input data available, finalize it */
            const unsigned char padding = 0x03; /* '110^6': message hop, simple padding */
            ktInstance->queueAbsorbedLen = 0;
            ktInstance->blockNumber = 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, &padding, 1) != 0)
                return 1;
            ktInstance->finalNode.byteIOIndex = (ktInstance->finalNode.byteIOIndex + 7) & ~7; /* Zero padding up to 64 bits */
        }
    }
    else if ( ktInstance->queueAbsorbedLen != 0 ) {
        /* There is data in the queue, absorb further in queue until block complete */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( ktInstance->queueAbsorbedLen == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ktInstance->queueAbsorbedLen = 0;
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
    }

    #if defined(KeccakP1600times8_implementation) && !defined(KeccakP1600times8_isFallback)
    #if defined(KeccakP1600times8_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 8 )
    #else
    ParallelSpongeLoop( 8 )
    #endif
    #endif

    #if defined(KeccakP1600times4_implementation) && !defined(KeccakP1600times4_isFallback)
    #if defined(KeccakP1600times4_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 4 )
    #else
    ParallelSpongeLoop( 4 )
    #endif
    #endif

    #if defined(KeccakP1600times2_implementation) && !defined(KeccakP1600times2_isFallback)
    #if defined(KeccakP1600times2_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 2 )
    #else
    ParallelSpongeLoop( 2 )
    #endif
    #endif

    while ( inLen > 0 ) {
        unsigned int len = (inLen < chunkSize) ? inLen : chunkSize;
        if (KeccakWidth1600_12rounds_SpongeInitialize(&ktInstance->queueNode, rate, capacity) != 0)
            return 1;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        if ( len == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        else
            ktInstance->queueAbsorbedLen = len;
    }

    return 0;
}